

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> *
__thiscall rcg::System::getInterfaces(System *this)

{
  GC_ERROR GVar1;
  int iVar2;
  size_type sVar3;
  element_type *peVar4;
  undefined8 uVar5;
  value_type *pvVar6;
  char *pcVar7;
  element_type *this_00;
  int __oflag;
  long in_RSI;
  char *pcVar8;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> *in_RDI
  ;
  size_t i_2;
  size_t i_1;
  int k;
  size_t size;
  char tmp [256];
  uint32_t i;
  uint32_t n;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> current
  ;
  lock_guard<std::recursive_mutex> lock;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> *ret;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000350;
  string *in_stack_00000358;
  GenTLException *in_stack_00000360;
  Interface *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd40;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *in_stack_fffffffffffffd48;
  value_type *__x;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *in_stack_fffffffffffffd50;
  shared_ptr<const_rcg::GenTLWrapper> *_gentl;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  Interface *in_stack_fffffffffffffd90;
  char *local_228;
  value_type *local_220;
  allocator local_1e9;
  string local_1e8 [32];
  int local_1c8;
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  size_t local_1a0;
  char local_198 [256];
  uint local_98;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  uint32_t local_70;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_48;
  undefined1 local_19;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffd40,
             (mutex_type *)in_stack_fffffffffffffd38);
  local_19 = 0;
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          *)in_stack_fffffffffffffd90,
         (vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  if ((*(long *)(in_RSI + 0x70) != 0) &&
     (sVar3 = std::
              vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
              ::size((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                      *)(in_RSI + 0x98)), sVar3 == 0)) {
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
              *)0x11102f);
    peVar4 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x111040);
    GVar1 = (*peVar4->TLUpdateInterfaceList)(*(TL_HANDLE *)(in_RSI + 0x70),(bool8_t *)0x0,10);
    if (GVar1 != 0) {
      local_6a = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"System::getInterfaces()",&local_69);
      GenTLException::GenTLException(in_stack_00000360,in_stack_00000358,in_stack_00000350);
      local_6a = 0;
      __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    local_70 = 0;
    peVar4 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1111ad);
    GVar1 = (*peVar4->TLGetNumInterfaces)(*(TL_HANDLE *)(in_RSI + 0x70),&local_70);
    if (GVar1 != 0) {
      local_92 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"System::getInterfaces()",&local_91);
      GenTLException::GenTLException(in_stack_00000360,in_stack_00000358,in_stack_00000350);
      local_92 = 0;
      __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    for (local_98 = 0; local_98 < local_70; local_98 = local_98 + 1) {
      pcVar8 = (char *)0x0;
      _gentl = (shared_ptr<const_rcg::GenTLWrapper> *)0x0;
      local_198[0xf0] = '\0';
      local_198[0xf1] = '\0';
      local_198[0xf2] = '\0';
      local_198[0xf3] = '\0';
      local_198[0xf4] = '\0';
      local_198[0xf5] = '\0';
      local_198[0xf6] = '\0';
      local_198[0xf7] = '\0';
      local_198[0xf8] = '\0';
      local_198[0xf9] = '\0';
      local_198[0xfa] = '\0';
      local_198[0xfb] = '\0';
      local_198[0xfc] = '\0';
      local_198[0xfd] = '\0';
      local_198[0xfe] = '\0';
      local_198[0xff] = '\0';
      local_198[0xe0] = '\0';
      local_198[0xe1] = '\0';
      local_198[0xe2] = '\0';
      local_198[0xe3] = '\0';
      local_198[0xe4] = '\0';
      local_198[0xe5] = '\0';
      local_198[0xe6] = '\0';
      local_198[0xe7] = '\0';
      local_198[0xe8] = '\0';
      local_198[0xe9] = '\0';
      local_198[0xea] = '\0';
      local_198[0xeb] = '\0';
      local_198[0xec] = '\0';
      local_198[0xed] = '\0';
      local_198[0xee] = '\0';
      local_198[0xef] = '\0';
      local_198[0xd0] = '\0';
      local_198[0xd1] = '\0';
      local_198[0xd2] = '\0';
      local_198[0xd3] = '\0';
      local_198[0xd4] = '\0';
      local_198[0xd5] = '\0';
      local_198[0xd6] = '\0';
      local_198[0xd7] = '\0';
      local_198[0xd8] = '\0';
      local_198[0xd9] = '\0';
      local_198[0xda] = '\0';
      local_198[0xdb] = '\0';
      local_198[0xdc] = '\0';
      local_198[0xdd] = '\0';
      local_198[0xde] = '\0';
      local_198[0xdf] = '\0';
      local_198[0xc0] = '\0';
      local_198[0xc1] = '\0';
      local_198[0xc2] = '\0';
      local_198[0xc3] = '\0';
      local_198[0xc4] = '\0';
      local_198[0xc5] = '\0';
      local_198[0xc6] = '\0';
      local_198[199] = '\0';
      local_198[200] = '\0';
      local_198[0xc9] = '\0';
      local_198[0xca] = '\0';
      local_198[0xcb] = '\0';
      local_198[0xcc] = '\0';
      local_198[0xcd] = '\0';
      local_198[0xce] = '\0';
      local_198[0xcf] = '\0';
      local_198[0xb0] = '\0';
      local_198[0xb1] = '\0';
      local_198[0xb2] = '\0';
      local_198[0xb3] = '\0';
      local_198[0xb4] = '\0';
      local_198[0xb5] = '\0';
      local_198[0xb6] = '\0';
      local_198[0xb7] = '\0';
      local_198[0xb8] = '\0';
      local_198[0xb9] = '\0';
      local_198[0xba] = '\0';
      local_198[0xbb] = '\0';
      local_198[0xbc] = '\0';
      local_198[0xbd] = '\0';
      local_198[0xbe] = '\0';
      local_198[0xbf] = '\0';
      local_198[0xa0] = '\0';
      local_198[0xa1] = '\0';
      local_198[0xa2] = '\0';
      local_198[0xa3] = '\0';
      local_198[0xa4] = '\0';
      local_198[0xa5] = '\0';
      local_198[0xa6] = '\0';
      local_198[0xa7] = '\0';
      local_198[0xa8] = '\0';
      local_198[0xa9] = '\0';
      local_198[0xaa] = '\0';
      local_198[0xab] = '\0';
      local_198[0xac] = '\0';
      local_198[0xad] = '\0';
      local_198[0xae] = '\0';
      local_198[0xaf] = '\0';
      local_198[0x90] = '\0';
      local_198[0x91] = '\0';
      local_198[0x92] = '\0';
      local_198[0x93] = '\0';
      local_198[0x94] = '\0';
      local_198[0x95] = '\0';
      local_198[0x96] = '\0';
      local_198[0x97] = '\0';
      local_198[0x98] = '\0';
      local_198[0x99] = '\0';
      local_198[0x9a] = '\0';
      local_198[0x9b] = '\0';
      local_198[0x9c] = '\0';
      local_198[0x9d] = '\0';
      local_198[0x9e] = '\0';
      local_198[0x9f] = '\0';
      local_198[0x80] = '\0';
      local_198[0x81] = '\0';
      local_198[0x82] = '\0';
      local_198[0x83] = '\0';
      local_198[0x84] = '\0';
      local_198[0x85] = '\0';
      local_198[0x86] = '\0';
      local_198[0x87] = '\0';
      local_198[0x88] = '\0';
      local_198[0x89] = '\0';
      local_198[0x8a] = '\0';
      local_198[0x8b] = '\0';
      local_198[0x8c] = '\0';
      local_198[0x8d] = '\0';
      local_198[0x8e] = '\0';
      local_198[0x8f] = '\0';
      local_198[0x70] = '\0';
      local_198[0x71] = '\0';
      local_198[0x72] = '\0';
      local_198[0x73] = '\0';
      local_198[0x74] = '\0';
      local_198[0x75] = '\0';
      local_198[0x76] = '\0';
      local_198[0x77] = '\0';
      local_198[0x78] = '\0';
      local_198[0x79] = '\0';
      local_198[0x7a] = '\0';
      local_198[0x7b] = '\0';
      local_198[0x7c] = '\0';
      local_198[0x7d] = '\0';
      local_198[0x7e] = '\0';
      local_198[0x7f] = '\0';
      local_198[0x60] = '\0';
      local_198[0x61] = '\0';
      local_198[0x62] = '\0';
      local_198[99] = '\0';
      local_198[100] = '\0';
      local_198[0x65] = '\0';
      local_198[0x66] = '\0';
      local_198[0x67] = '\0';
      local_198[0x68] = '\0';
      local_198[0x69] = '\0';
      local_198[0x6a] = '\0';
      local_198[0x6b] = '\0';
      local_198[0x6c] = '\0';
      local_198[0x6d] = '\0';
      local_198[0x6e] = '\0';
      local_198[0x6f] = '\0';
      local_198[0x50] = '\0';
      local_198[0x51] = '\0';
      local_198[0x52] = '\0';
      local_198[0x53] = '\0';
      local_198[0x54] = '\0';
      local_198[0x55] = '\0';
      local_198[0x56] = '\0';
      local_198[0x57] = '\0';
      local_198[0x58] = '\0';
      local_198[0x59] = '\0';
      local_198[0x5a] = '\0';
      local_198[0x5b] = '\0';
      local_198[0x5c] = '\0';
      local_198[0x5d] = '\0';
      local_198[0x5e] = '\0';
      local_198[0x5f] = '\0';
      local_198[0x40] = '\0';
      local_198[0x41] = '\0';
      local_198[0x42] = '\0';
      local_198[0x43] = '\0';
      local_198[0x44] = '\0';
      local_198[0x45] = '\0';
      local_198[0x46] = '\0';
      local_198[0x47] = '\0';
      local_198[0x48] = '\0';
      local_198[0x49] = '\0';
      local_198[0x4a] = '\0';
      local_198[0x4b] = '\0';
      local_198[0x4c] = '\0';
      local_198[0x4d] = '\0';
      local_198[0x4e] = '\0';
      local_198[0x4f] = '\0';
      local_198[0x30] = '\0';
      local_198[0x31] = '\0';
      local_198[0x32] = '\0';
      local_198[0x33] = '\0';
      local_198[0x34] = '\0';
      local_198[0x35] = '\0';
      local_198[0x36] = '\0';
      local_198[0x37] = '\0';
      local_198[0x38] = '\0';
      local_198[0x39] = '\0';
      local_198[0x3a] = '\0';
      local_198[0x3b] = '\0';
      local_198[0x3c] = '\0';
      local_198[0x3d] = '\0';
      local_198[0x3e] = '\0';
      local_198[0x3f] = '\0';
      local_198[0x20] = '\0';
      local_198[0x21] = '\0';
      local_198[0x22] = '\0';
      local_198[0x23] = '\0';
      local_198[0x24] = '\0';
      local_198[0x25] = '\0';
      local_198[0x26] = '\0';
      local_198[0x27] = '\0';
      local_198[0x28] = '\0';
      local_198[0x29] = '\0';
      local_198[0x2a] = '\0';
      local_198[0x2b] = '\0';
      local_198[0x2c] = '\0';
      local_198[0x2d] = '\0';
      local_198[0x2e] = '\0';
      local_198[0x2f] = '\0';
      local_198[0x10] = '\0';
      local_198[0x11] = '\0';
      local_198[0x12] = '\0';
      local_198[0x13] = '\0';
      local_198[0x14] = '\0';
      local_198[0x15] = '\0';
      local_198[0x16] = '\0';
      local_198[0x17] = '\0';
      local_198[0x18] = '\0';
      local_198[0x19] = '\0';
      local_198[0x1a] = '\0';
      local_198[0x1b] = '\0';
      local_198[0x1c] = '\0';
      local_198[0x1d] = '\0';
      local_198[0x1e] = '\0';
      local_198[0x1f] = '\0';
      local_198[0] = '\0';
      local_198[1] = '\0';
      local_198[2] = '\0';
      local_198[3] = '\0';
      local_198[4] = '\0';
      local_198[5] = '\0';
      local_198[6] = '\0';
      local_198[7] = '\0';
      local_198[8] = '\0';
      local_198[9] = '\0';
      local_198[10] = '\0';
      local_198[0xb] = '\0';
      local_198[0xc] = '\0';
      local_198[0xd] = '\0';
      local_198[0xe] = '\0';
      local_198[0xf] = '\0';
      local_1a0 = 0x100;
      peVar4 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x111389);
      GVar1 = (*peVar4->TLGetInterfaceID)
                        (*(TL_HANDLE *)(in_RSI + 0x70),local_98,local_198,&local_1a0);
      if (GVar1 != 0) {
        local_1c2 = 1;
        uVar5 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"System::getInterfaces()",&local_1c1);
        GenTLException::GenTLException(in_stack_00000360,in_stack_00000358,in_stack_00000350);
        local_1c2 = 0;
        __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,local_198,&local_1e9);
      iVar2 = anon_unknown_0::find(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      local_1c8 = iVar2;
      if (iVar2 < 0) {
        in_stack_fffffffffffffd50 =
             (vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
              *)operator_new(0xc0);
        std::enable_shared_from_this<rcg::System>::shared_from_this
                  ((enable_shared_from_this<rcg::System> *)in_stack_fffffffffffffd38);
        Interface::Interface
                  (in_stack_fffffffffffffd90,
                   (shared_ptr<rcg::System> *)CONCAT44(GVar1,in_stack_fffffffffffffd88),_gentl,
                   pcVar8);
        std::shared_ptr<rcg::Interface>::shared_ptr<rcg::Interface,void>
                  ((shared_ptr<rcg::Interface> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38
                  );
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        push_back((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                   *)in_stack_fffffffffffffd40,(value_type *)in_stack_fffffffffffffd38);
        std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x111635);
        std::shared_ptr<rcg::System>::~shared_ptr((shared_ptr<rcg::System> *)0x111642);
      }
      else {
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        operator[](&local_48,(long)iVar2);
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        push_back(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      }
    }
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::clear((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
             *)0x1116e5);
    local_220 = (value_type *)0x0;
    while (__x = local_220,
          pvVar6 = (value_type *)
                   std::
                   vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                   ::size(in_RDI), __x < pvVar6) {
      std::
      vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
      operator[](in_RDI,(size_type)local_220);
      std::
      vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
      push_back(in_stack_fffffffffffffd50,__x);
      local_220 = (value_type *)
                  ((long)&(local_220->super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + 1);
    }
    local_228 = (char *)0x0;
    while (pcVar8 = local_228,
          pcVar7 = (char *)std::
                           vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ::size(in_RDI), pcVar8 < pcVar7) {
      pcVar8 = local_228;
      std::
      vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
      operator[](in_RDI,(size_type)local_228);
      this_00 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1117b5);
      Interface::open(this_00,pcVar8,__oflag);
      local_228 = local_228 + 1;
    }
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::~vector(in_stack_fffffffffffffd50);
  }
  local_19 = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x11182e);
  return in_RDI;
}

Assistant:

std::vector<std::shared_ptr<Interface> > System::getInterfaces()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  std::vector<std::shared_ptr<Interface> > ret=ilist;

  // ENUM-WORKAROUND: Interfaces are only enumerated once and kept open as a
  // (temporary) workaround for a bug in the Baumer GenTL layer 2.1.0 for GEV
  // that is used by default. The bug causes memory and CPU time to
  // increase on every call of TLUpdateInterfaceList().

  if (tl != 0 && ilist.size() == 0)
  {
    // get list of previously requested interfaces that are still in use

    std::vector<std::shared_ptr<Interface> > current;

/*
    for (size_t i=0; i<ilist.size(); i++)
    {
      std::shared_ptr<Interface> p=ilist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }
*/

    // update available interfaces

    if (gentl->TLUpdateInterfaceList(tl, 0, 10) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::getInterfaces()", gentl);
    }

    // create list of interfaces, using either existing interfaces or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->TLGetNumInterfaces(tl, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::getInterfaces()", gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->TLGetInterfaceID(tl, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("System::getInterfaces()", gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Interface>(new Interface(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of interfaces for reusage on next call

    ilist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      ilist.push_back(ret[i]);
    }

    // open interfaces to avoid re-enumeration as part of ENUM-WORKAROUND

    for (size_t i=0; i<ret.size(); i++)
    {
      ret[i]->open();
    }
  }

  return ret;
}